

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O2

void nn_sock_stat_increment(nn_sock *self,int name,int64_t increment)

{
  uint64_t *puVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  undefined8 uVar6;
  
  switch(name) {
  case 0x65:
    if (0 < increment) {
      (self->statistics).established_connections =
           (self->statistics).established_connections + increment;
      return;
    }
    nn_backtrace_print();
    pcVar5 = "increment > 0";
    uVar6 = 0x409;
    break;
  case 0x66:
    if (0 < increment) {
      puVar1 = &(self->statistics).accepted_connections;
      *puVar1 = *puVar1 + increment;
      return;
    }
    nn_backtrace_print();
    pcVar5 = "increment > 0";
    uVar6 = 0x40d;
    break;
  case 0x67:
    if (0 < increment) {
      puVar1 = &(self->statistics).dropped_connections;
      *puVar1 = *puVar1 + increment;
      return;
    }
    nn_backtrace_print();
    pcVar5 = "increment > 0";
    uVar6 = 0x411;
    break;
  case 0x68:
    if (0 < increment) {
      puVar1 = &(self->statistics).broken_connections;
      *puVar1 = *puVar1 + increment;
      return;
    }
    nn_backtrace_print();
    pcVar5 = "increment > 0";
    uVar6 = 0x415;
    break;
  case 0x69:
    if (0 < increment) {
      puVar1 = &(self->statistics).connect_errors;
      *puVar1 = *puVar1 + increment;
      return;
    }
    nn_backtrace_print();
    pcVar5 = "increment > 0";
    uVar6 = 0x419;
    break;
  case 0x6a:
    if (0 < increment) {
      puVar1 = &(self->statistics).bind_errors;
      *puVar1 = *puVar1 + increment;
      return;
    }
    nn_backtrace_print();
    pcVar5 = "increment > 0";
    uVar6 = 0x41d;
    break;
  case 0x6b:
    if (0 < increment) {
      puVar1 = &(self->statistics).accept_errors;
      *puVar1 = *puVar1 + increment;
      return;
    }
    nn_backtrace_print();
    pcVar5 = "increment > 0";
    uVar6 = 0x421;
    break;
  default:
    switch(name) {
    case 0x12d:
      if (0 < increment) {
        puVar1 = &(self->statistics).messages_sent;
        *puVar1 = *puVar1 + increment;
        return;
      }
      nn_backtrace_print();
      pcVar5 = "increment > 0";
      uVar6 = 0x425;
      break;
    case 0x12e:
      if (0 < increment) {
        puVar1 = &(self->statistics).messages_received;
        *puVar1 = *puVar1 + increment;
        return;
      }
      nn_backtrace_print();
      pcVar5 = "increment > 0";
      uVar6 = 0x429;
      break;
    case 0x12f:
      if (-1 < increment) {
        puVar1 = &(self->statistics).bytes_sent;
        *puVar1 = *puVar1 + increment;
        return;
      }
      nn_backtrace_print();
      pcVar5 = "increment >= 0";
      uVar6 = 0x42d;
      break;
    case 0x130:
      if (-1 < increment) {
        puVar1 = &(self->statistics).bytes_received;
        *puVar1 = *puVar1 + increment;
        return;
      }
      nn_backtrace_print();
      pcVar5 = "increment >= 0";
      uVar6 = 0x431;
      break;
    default:
      iVar4 = (int)increment;
      if (name == 0xc9) {
        if ((increment < 1) &&
           (lVar3 = (long)(self->statistics).current_connections,
           SBORROW8(lVar3,-increment) != lVar3 + increment < 0)) {
          nn_backtrace_print();
          pcVar5 = "increment > 0 || self->statistics.current_connections >= -increment";
          uVar6 = 0x437;
        }
        else {
          if (0xffffffff00000002 < increment - 0x7fffffffU) {
            piVar2 = &(self->statistics).current_connections;
            *piVar2 = *piVar2 + iVar4;
            return;
          }
          nn_backtrace_print();
          pcVar5 = "increment < INT_MAX && increment > -INT_MAX";
          uVar6 = 0x438;
        }
      }
      else if (name == 0xca) {
        if ((increment < 1) &&
           (lVar3 = (long)(self->statistics).inprogress_connections,
           SBORROW8(lVar3,-increment) != lVar3 + increment < 0)) {
          nn_backtrace_print();
          pcVar5 = "increment > 0 || self->statistics.inprogress_connections >= -increment";
          uVar6 = 0x43d;
        }
        else {
          if (0xffffffff00000002 < increment - 0x7fffffffU) {
            piVar2 = &(self->statistics).inprogress_connections;
            *piVar2 = *piVar2 + iVar4;
            return;
          }
          nn_backtrace_print();
          pcVar5 = "increment < INT_MAX && increment > -INT_MAX";
          uVar6 = 0x43e;
        }
      }
      else if (name == 0xcb) {
        if ((increment < 1) &&
           (lVar3 = (long)(self->statistics).current_ep_errors,
           SBORROW8(lVar3,-increment) != lVar3 + increment < 0)) {
          nn_backtrace_print();
          pcVar5 = "increment > 0 || self->statistics.current_ep_errors >= -increment";
          uVar6 = 0x448;
        }
        else {
          if (0xffffffff00000002 < increment - 0x7fffffffU) {
            piVar2 = &(self->statistics).current_ep_errors;
            *piVar2 = *piVar2 + iVar4;
            return;
          }
          nn_backtrace_print();
          pcVar5 = "increment < INT_MAX && increment > -INT_MAX";
          uVar6 = 0x449;
        }
      }
      else {
        if (name != 0x191) {
          return;
        }
        if (increment == -1 || 0xffffffffffffffef < increment - 0x11U) {
          (self->statistics).current_snd_priority = iVar4;
          return;
        }
        nn_backtrace_print();
        pcVar5 = "(increment > 0 && increment <= 16) || increment == -1";
        uVar6 = 0x443;
      }
    }
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/sock.c"
          ,uVar6);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_sock_stat_increment (struct nn_sock *self, int name, int64_t increment)
{
    switch (name) {
        case NN_STAT_ESTABLISHED_CONNECTIONS:
            nn_assert (increment > 0);
            self->statistics.established_connections += increment;
            break;
        case NN_STAT_ACCEPTED_CONNECTIONS:
            nn_assert (increment > 0);
            self->statistics.accepted_connections += increment;
            break;
        case NN_STAT_DROPPED_CONNECTIONS:
            nn_assert (increment > 0);
            self->statistics.dropped_connections += increment;
            break;
        case NN_STAT_BROKEN_CONNECTIONS:
            nn_assert (increment > 0);
            self->statistics.broken_connections += increment;
            break;
        case NN_STAT_CONNECT_ERRORS:
            nn_assert (increment > 0);
            self->statistics.connect_errors += increment;
            break;
        case NN_STAT_BIND_ERRORS:
            nn_assert (increment > 0);
            self->statistics.bind_errors += increment;
            break;
        case NN_STAT_ACCEPT_ERRORS:
            nn_assert (increment > 0);
            self->statistics.accept_errors += increment;
            break;
        case NN_STAT_MESSAGES_SENT:
            nn_assert (increment > 0);
            self->statistics.messages_sent += increment;
            break;
        case NN_STAT_MESSAGES_RECEIVED:
            nn_assert (increment > 0);
            self->statistics.messages_received += increment;
            break;
        case NN_STAT_BYTES_SENT:
            nn_assert (increment >= 0);
            self->statistics.bytes_sent += increment;
            break;
        case NN_STAT_BYTES_RECEIVED:
            nn_assert (increment >= 0);
            self->statistics.bytes_received += increment;
            break;

        case NN_STAT_CURRENT_CONNECTIONS:
            nn_assert (increment > 0 ||
                self->statistics.current_connections >= -increment);
            nn_assert(increment < INT_MAX && increment > -INT_MAX);
            self->statistics.current_connections += (int) increment;
            break;
        case NN_STAT_INPROGRESS_CONNECTIONS:
            nn_assert (increment > 0 ||
                self->statistics.inprogress_connections >= -increment);
            nn_assert(increment < INT_MAX && increment > -INT_MAX);
            self->statistics.inprogress_connections += (int) increment;
            break;
        case NN_STAT_CURRENT_SND_PRIORITY:
            /*  This is an exception, we don't want to increment priority  */
            nn_assert((increment > 0 && increment <= 16) || increment == -1);
            self->statistics.current_snd_priority = (int) increment;
            break;
        case NN_STAT_CURRENT_EP_ERRORS:
            nn_assert (increment > 0 ||
                self->statistics.current_ep_errors >= -increment);
            nn_assert(increment < INT_MAX && increment > -INT_MAX);
            self->statistics.current_ep_errors += (int) increment;
            break;
    }
}